

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseCapabilityDirective
          (Parser *this,bool *isunused,bool *isinline,bool *isconstant)

{
  bool bVar1;
  Token *pTVar2;
  Lexer *pLVar3;
  undefined1 local_80 [24];
  undefined1 local_68 [8];
  string str;
  Token *local_30;
  Token *tokId;
  bool *isconstant_local;
  bool *isinline_local;
  bool *isunused_local;
  Parser *this_local;
  
  tokId = (Token *)isconstant;
  isconstant_local = isinline;
  isinline_local = isunused;
  isunused_local = (bool *)this;
  sanityExpect(this,TOK_DIRECTIVE);
  local_30 = Lexer::getCurrentToken(this->lexer);
  bVar1 = expect(this,TOK_ID);
  pTVar2 = local_30;
  if (bVar1) {
    pLVar3 = getLexer(this);
    (*pTVar2->_vptr_Token[2])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,pTVar2,
               pLVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"Unused");
    if ((bVar1) && ((*isinline_local & 1U) == 0)) {
      *isinline_local = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"Inline");
      if ((bVar1) && ((*isconstant_local & 1U) == 0)) {
        *isconstant_local = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"Constant");
        if ((bVar1) && (((ulong)tokId->_vptr_Token & 1) == 0)) {
          *(undefined1 *)&tokId->_vptr_Token = 1;
        }
        else {
          local_80._6_2_ = 2;
          local_80._0_4_ = 0x28;
          pTVar2 = Lexer::getCurrentToken(this->lexer);
          Token::getPosition(pTVar2);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)(local_80 + 8),(SyntaxErrorCode *)(local_80 + 6),(Position *)local_80)
          ;
          generateError((Parser *)(local_80 + 0x10),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_80 + 0x10));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_80 + 8));
        }
      }
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    str.field_2._14_2_ = 2;
    str.field_2._8_4_ = 0x28;
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&stack0xffffffffffffffc0,(SyntaxErrorCode *)(str.field_2._M_local_buf + 0xe)
               ,(Position *)((long)&str.field_2 + 8));
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void Parser::parseCapabilityDirective(bool &isunused, bool &isinline, bool &isconstant) noexcept {
  sanityExpect(TokenType::TOK_DIRECTIVE);

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
    return;
  }

  std::string str = tokId->toString(getLexer());
  if (str == "Unused" && !isunused) {
    isunused = true;
  } else if (str == "Inline" && !isinline) {
    isinline = true;
  } else if (str == "Constant" && !isconstant) {
    isconstant = true;
  } else {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
  }
}